

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O2

bool tcu::isLevel3DLookupResultValid
               (ConstPixelBufferAccess *access,Sampler *sampler,TexLookupScaleMode scaleMode,
               IntLookupPrecision *prec,Vec3 *coord,IVec4 *result)

{
  bool bVar1;
  int i_00;
  int j_00;
  int k;
  int c;
  int i;
  int c_00;
  int j;
  int c_01;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  Vec2 wBounds;
  Vec2 vBounds;
  Vec2 uBounds;
  Vector<int,_4> color;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  tcu local_40 [16];
  
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_48,sampler->normalizedCoords,(access->m_size).m_data[0],
             coord->m_data[0],(prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_50,sampler->normalizedCoords,(access->m_size).m_data[1],
             coord->m_data[1],(prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_58,sampler->normalizedCoords,(access->m_size).m_data[2],
             coord->m_data[2],(prec->coordBits).m_data[2],(prec->uvwBits).m_data[2]);
  fVar2 = floorf(local_48);
  fVar3 = floorf(local_44);
  fVar4 = floorf(local_50);
  fVar5 = floorf(local_4c);
  fVar6 = floorf(local_58);
  fVar7 = floorf(local_54);
  for (c = (int)fVar6; c_01 = (int)fVar4, c <= (int)fVar7; c = c + 1) {
    for (; c_00 = (int)fVar2, c_01 <= (int)fVar5; c_01 = c_01 + 1) {
      while (c_00 <= (int)fVar3) {
        i_00 = TexVerifierUtil::wrap(sampler->wrapS,c_00,(access->m_size).m_data[0]);
        j_00 = TexVerifierUtil::wrap(sampler->wrapT,c_01,(access->m_size).m_data[1]);
        k = TexVerifierUtil::wrap(sampler->wrapR,c,(access->m_size).m_data[2]);
        lookup<int>(local_40,access,sampler,i_00,j_00,k);
        bVar1 = isColorValid(prec,(IVec4 *)local_40,result);
        c_00 = c_00 + 1;
        if (bVar1) goto LAB_0161bd25;
      }
    }
  }
LAB_0161bd25:
  return c <= (int)fVar7;
}

Assistant:

bool isLevel3DLookupResultValid (const ConstPixelBufferAccess&	access,
								 const Sampler&					sampler,
								 TexLookupScaleMode				scaleMode,
								 const IntLookupPrecision&		prec,
								 const Vec3&					coord,
								 const IVec4&					result)
{
	DE_ASSERT(sampler.minFilter == Sampler::NEAREST && sampler.magFilter == Sampler::NEAREST);
	DE_UNREF(scaleMode);
	return isNearestSampleResultValid(access, sampler, prec, coord, result);
}